

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

void MakeCrcTable(void)

{
  uint local_14;
  uint local_10;
  UINT32 Temp;
  UINT32 Index2;
  UINT32 Index;
  
  for (Temp = 0; Temp < 0x100; Temp = Temp + 1) {
    local_14 = Temp;
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      if ((local_14 & 1) == 0) {
        local_14 = local_14 >> 1;
      }
      else {
        local_14 = local_14 >> 1 ^ 0xa001;
      }
    }
    mCrcTable[Temp] = (UINT16)local_14;
  }
  return;
}

Assistant:

STATIC
  VOID
  MakeCrcTable (
  VOID
  )
{
  UINT32  Index;
  UINT32  Index2;
  UINT32  Temp;

  for (Index = 0; Index <= UINT8_MAX; Index++) {
    Temp = Index;
    for (Index2 = 0; Index2 < UINT8_BIT; Index2++) {
      if (Temp & 1) {
        Temp = (Temp >> 1) ^ CRCPOLY;
      } else {
        Temp >>= 1;
      }
    }

    mCrcTable[Index] = (UINT16) Temp;
  }
}